

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

void __thiscall sf::Texture::swap(Texture *this,Texture *right)

{
  Vector2<unsigned_int> VVar1;
  Vector2<unsigned_int> *in_RSI;
  Vector2<unsigned_int> *in_RDI;
  
  std::swap<sf::Vector2<unsigned_int>>(in_RDI,in_RSI);
  std::swap<sf::Vector2<unsigned_int>>(in_RDI + 1,in_RSI + 1);
  std::swap<unsigned_int>(&in_RDI[2].x,&in_RSI[2].x);
  std::swap<bool>((bool *)&in_RDI[2].y,(bool *)&in_RSI[2].y);
  std::swap<bool>((bool *)((long)&in_RDI[2].y + 1),(bool *)((long)&in_RSI[2].y + 1));
  std::swap<bool>((bool *)((long)&in_RDI[2].y + 2),(bool *)((long)&in_RSI[2].y + 2));
  std::swap<bool>((bool *)((long)&in_RDI[2].y + 3),(bool *)((long)&in_RSI[2].y + 3));
  std::swap<bool>((bool *)(in_RDI + 3),(bool *)(in_RSI + 3));
  std::swap<bool>((bool *)((long)&in_RDI[3].x + 1),(bool *)((long)&in_RSI[3].x + 1));
  VVar1 = (Vector2<unsigned_int>)anon_unknown.dwarf_86926::getUniqueId();
  in_RDI[4] = VVar1;
  VVar1 = (Vector2<unsigned_int>)anon_unknown.dwarf_86926::getUniqueId();
  in_RSI[4] = VVar1;
  return;
}

Assistant:

void Texture::swap(Texture& right)
{
    std::swap(m_size,          right.m_size);
    std::swap(m_actualSize,    right.m_actualSize);
    std::swap(m_texture,       right.m_texture);
    std::swap(m_isSmooth,      right.m_isSmooth);
    std::swap(m_sRgb,          right.m_sRgb);
    std::swap(m_isRepeated,    right.m_isRepeated);
    std::swap(m_pixelsFlipped, right.m_pixelsFlipped);
    std::swap(m_fboAttachment, right.m_fboAttachment);
    std::swap(m_hasMipmap,     right.m_hasMipmap);

    m_cacheId = getUniqueId();
    right.m_cacheId = getUniqueId();
}